

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primrefgen.cpp
# Opt level: O1

PrimInfo *
embree::sse2::createPrimRefArrayGrids
          (PrimInfo *__return_storage_ptr__,GridMesh *mesh,mvector<PrimRef> *prims,
          mvector<SubGridBuildData> *sgrids)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  SubGridBuildData *ptr;
  PrimRef *ptr_00;
  MemoryMonitorInterface *pMVar3;
  undefined8 uVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  task *ptVar8;
  size_t sVar9;
  SubGridBuildData *pSVar10;
  PrimRef *pPVar11;
  long lVar12;
  runtime_error *prVar13;
  ulong uVar14;
  size_t *psVar15;
  size_t sVar16;
  ulong uVar17;
  _func_int **pp_Var18;
  ulong uVar19;
  _func_int **pp_Var20;
  PrimInfo *pPVar21;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar22;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar23;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar24;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar25;
  size_t taskCount;
  small_object_allocator alloc;
  uint geomID_;
  task_group_context context;
  ParallelPrefixSumState<embree::PrimInfoT<embree::BBox<embree::Vec3fa>_>_> pstate;
  _func_int **local_2960;
  PrimInfo *local_2958;
  ulong local_2950;
  long local_2948;
  long **local_2940;
  task_traits local_2938;
  undefined4 local_292c;
  GridMesh *local_2928;
  GridMesh **local_2920;
  mvector<PrimRef> *local_2918;
  mvector<SubGridBuildData> *local_2910;
  undefined4 *local_2908;
  long *local_2900;
  ulong *local_28f8;
  _func_int ***local_28f0;
  undefined1 *local_28e8;
  GridMesh ***local_28e0;
  undefined8 local_28d8;
  undefined4 local_28d0;
  wait_context local_28c8;
  task_group_context local_28b8;
  undefined1 local_2838 [5192];
  size_t local_13f0 [632];
  
  local_2920 = &local_2928;
  local_2918 = (mvector<PrimRef> *)&local_292c;
  local_292c = 0xffffffff;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = 0x7f8000007f800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = 0x7f8000007f800000;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = 0xff800000ff800000;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = 0xff800000ff800000;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  local_2950 = (ulong)(mesh->super_Geometry).numPrimitives;
  local_2948 = 0;
  local_2958 = __return_storage_ptr__;
  local_2928 = mesh;
  iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var20 = (_func_int **)((local_2950 - local_2948) + 0x3ff >> 10);
  if ((_func_int **)(long)iVar7 < pp_Var20) {
    pp_Var20 = (_func_int **)(long)iVar7;
  }
  pp_Var18 = (_func_int **)0x40;
  if (pp_Var20 < (_func_int **)0x40) {
    pp_Var18 = pp_Var20;
  }
  local_28f0 = &local_2960;
  local_28e8 = local_2838;
  local_28e0 = &local_2920;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2960 = pp_Var18;
  local_2900 = &local_2948;
  local_28f8 = &local_2950;
  tbb::detail::r1::initialize(&local_28b8);
  local_2940 = &local_2900;
  if (pp_Var20 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar8 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar8->m_reserved[3] = 0;
    ptVar8->m_reserved[4] = 0;
    ptVar8->m_reserved[1] = 0;
    ptVar8->m_reserved[2] = 0;
    (ptVar8->super_task_traits).m_version_and_traits = 0;
    ptVar8->m_reserved[0] = 0;
    ptVar8->m_reserved[5] = 0;
    ptVar8->_vptr_task = (_func_int **)&PTR__task_022071b8;
    ptVar8[1]._vptr_task = pp_Var18;
    ptVar8[1].super_task_traits.m_version_and_traits = 0;
    ptVar8[1].m_reserved[0] = 1;
    ptVar8[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar8[1].m_reserved[2] = 0;
    ptVar8[1].m_reserved[3] = 1;
    iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar8[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar8[2]._vptr_task + 4) = 5;
    ptVar8[1].m_reserved[5] = ((long)iVar7 & 0x3fffffffffffffffU) * 2;
    ptVar8[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar8[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar8,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  pPVar21 = local_2958;
  if (cVar6 != '\0') {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"task cancelled");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  aVar22 = _DAT_01feb9f0;
  aVar23 = _DAT_01feba00;
  aVar24 = _DAT_01feb9f0;
  aVar25 = _DAT_01feba00;
  if (local_2960 == (_func_int **)0x0) {
    sVar9 = 0;
    sVar16 = 0;
  }
  else {
    psVar15 = local_13f0;
    sVar16 = 0;
    sVar9 = 0;
    pp_Var20 = local_2960;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -9) = aVar24;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -7) = aVar25;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -5) = aVar22;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -3) = aVar23;
      psVar15[-1] = sVar9;
      *psVar15 = sVar16;
      aVar24.m128 = (__m128)minps(aVar24.m128,*(undefined1 (*) [16])(psVar15 + -0x289));
      aVar25.m128 = (__m128)maxps(aVar25.m128,*(undefined1 (*) [16])(psVar15 + -0x287));
      aVar22.m128 = (__m128)minps(aVar22.m128,*(undefined1 (*) [16])(psVar15 + -0x285));
      aVar23.m128 = (__m128)maxps(aVar23.m128,*(undefined1 (*) [16])(psVar15 + -0x283));
      sVar9 = sVar9 + psVar15[-0x281];
      sVar16 = sVar16 + psVar15[-0x280];
      psVar15 = psVar15 + 10;
      pp_Var20 = (_func_int **)((long)pp_Var20 + -1);
    } while (pp_Var20 != (_func_int **)0x0);
  }
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar24;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar25;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar22;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar23;
  pPVar21->begin = sVar9;
  pPVar21->end = sVar16;
  uVar17 = sVar16 - sVar9;
  uVar14 = sgrids->size_alloced;
  uVar19 = uVar14;
  if ((uVar14 < uVar17) && (uVar19 = uVar17, uVar5 = uVar14, uVar14 != 0)) {
    while (uVar19 = uVar5, uVar19 < uVar17) {
      uVar5 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0);
    }
  }
  if (uVar17 < sgrids->size_active) {
    sgrids->size_active = uVar17;
  }
  if (uVar14 == uVar19) {
    sgrids->size_active = uVar17;
  }
  else {
    ptr = sgrids->items;
    if (uVar19 != 0) {
      pMVar3 = (sgrids->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar19 * 8,0);
    }
    uVar14 = uVar19 * 8;
    if (uVar14 < 0x1c00000) {
      pSVar10 = (SubGridBuildData *)alignedMalloc(uVar14,4);
    }
    else {
      pSVar10 = (SubGridBuildData *)os_malloc(uVar14,&(sgrids->alloc).hugepages);
    }
    sgrids->items = pSVar10;
    if (sgrids->size_active != 0) {
      uVar14 = 0;
      do {
        sgrids->items[uVar14] = ptr[uVar14];
        uVar14 = uVar14 + 1;
      } while (uVar14 < sgrids->size_active);
    }
    sVar9 = sgrids->size_alloced;
    if (ptr != (SubGridBuildData *)0x0) {
      if (sVar9 * 8 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar9 * 8,(sgrids->alloc).hugepages);
      }
    }
    if (sVar9 != 0) {
      pMVar3 = (sgrids->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar9 * -8,1);
    }
    sgrids->size_active = uVar17;
    sgrids->size_alloced = uVar19;
    pPVar21 = local_2958;
  }
  uVar14 = prims->size_alloced;
  uVar19 = uVar14;
  if ((uVar14 < uVar17) && (uVar19 = uVar17, uVar5 = uVar14, uVar14 != 0)) {
    while (uVar19 = uVar5, uVar19 < uVar17) {
      uVar5 = uVar19 * 2 + (ulong)(uVar19 * 2 == 0);
    }
  }
  if (uVar17 < prims->size_active) {
    prims->size_active = uVar17;
  }
  if (uVar14 == uVar19) {
    prims->size_active = uVar17;
  }
  else {
    ptr_00 = prims->items;
    if (uVar19 != 0) {
      pMVar3 = (prims->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,uVar19 << 5,0);
    }
    sVar9 = uVar19 << 5;
    if (sVar9 < 0x1c00000) {
      pPVar11 = (PrimRef *)alignedMalloc(sVar9,0x20);
    }
    else {
      pPVar11 = (PrimRef *)os_malloc(sVar9,&(prims->alloc).hugepages);
    }
    prims->items = pPVar11;
    if (prims->size_active != 0) {
      lVar12 = 0x10;
      uVar14 = 0;
      do {
        pPVar11 = prims->items;
        puVar1 = (undefined8 *)((long)ptr_00 + lVar12 + -0x10);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)pPVar11 + lVar12 + -0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar1 = (undefined8 *)((long)&(ptr_00->lower).field_0 + lVar12);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)&(pPVar11->lower).field_0 + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        uVar14 = uVar14 + 1;
        lVar12 = lVar12 + 0x20;
      } while (uVar14 < prims->size_active);
    }
    sVar9 = prims->size_alloced;
    if (ptr_00 != (PrimRef *)0x0) {
      if (sVar9 << 5 < 0x1c00000) {
        alignedFree(ptr_00);
      }
      else {
        os_free(ptr_00,sVar9 << 5,(prims->alloc).hugepages);
      }
    }
    if (sVar9 != 0) {
      pMVar3 = (prims->alloc).device;
      (**pMVar3->_vptr_MemoryMonitorInterface)(pMVar3,sVar9 * -0x20,1);
    }
    prims->size_active = uVar17;
    prims->size_alloced = uVar19;
    pPVar21 = local_2958;
  }
  local_2950 = (ulong)(local_2928->super_Geometry).numPrimitives;
  local_2920 = &local_2928;
  local_2908 = &local_292c;
  local_2948 = 0;
  local_2918 = prims;
  local_2910 = sgrids;
  iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
  pp_Var20 = (_func_int **)((local_2950 - local_2948) + 0x3ff >> 10);
  if ((_func_int **)(long)iVar7 < pp_Var20) {
    pp_Var20 = (_func_int **)(long)iVar7;
  }
  pp_Var18 = (_func_int **)0x40;
  if (pp_Var20 < (_func_int **)0x40) {
    pp_Var18 = pp_Var20;
  }
  local_2900 = &local_2948;
  local_28f8 = &local_2950;
  local_28f0 = &local_2960;
  local_28e8 = local_2838;
  local_28e0 = &local_2920;
  local_28b8.my_version = proxy_support;
  local_28b8.my_traits = (context_traits)0x4;
  local_28b8.my_node.my_prev_node = (intrusive_list_node *)0x0;
  local_28b8.my_node.my_next_node = (intrusive_list_node *)0x0;
  local_28b8.my_name = CUSTOM_CTX;
  local_2960 = pp_Var18;
  tbb::detail::r1::initialize(&local_28b8);
  local_2940 = &local_2900;
  if (pp_Var20 != (_func_int **)0x0) {
    local_2938.m_version_and_traits = 0;
    ptVar8 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_2938,0xc0);
    ptVar8->m_reserved[3] = 0;
    ptVar8->m_reserved[4] = 0;
    ptVar8->m_reserved[1] = 0;
    ptVar8->m_reserved[2] = 0;
    (ptVar8->super_task_traits).m_version_and_traits = 0;
    ptVar8->m_reserved[0] = 0;
    ptVar8->m_reserved[5] = 0;
    ptVar8->_vptr_task = (_func_int **)&PTR__task_02207200;
    ptVar8[1]._vptr_task = pp_Var18;
    ptVar8[1].super_task_traits.m_version_and_traits = 0;
    ptVar8[1].m_reserved[0] = 1;
    ptVar8[1].m_reserved[1] = (uint64_t)&local_2940;
    ptVar8[1].m_reserved[2] = 0;
    ptVar8[1].m_reserved[3] = 1;
    iVar7 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    *(undefined4 *)&ptVar8[2]._vptr_task = 0;
    *(undefined1 *)((long)&ptVar8[2]._vptr_task + 4) = 5;
    ptVar8[1].m_reserved[5] = ((long)iVar7 & 0x3fffffffffffffffU) * 2;
    ptVar8[2].super_task_traits.m_version_and_traits = local_2938.m_version_and_traits;
    local_28d8 = 0;
    local_28d0 = 1;
    local_28c8.m_version_and_traits = 1;
    local_28c8.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1
    ;
    ptVar8[1].m_reserved[4] = (uint64_t)&local_28d8;
    tbb::detail::r1::execute_and_wait(ptVar8,&local_28b8,&local_28c8,&local_28b8);
  }
  cVar6 = tbb::detail::r1::is_group_execution_cancelled(&local_28b8);
  if (cVar6 != '\0') {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar13,"task cancelled");
    __cxa_throw(prVar13,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tbb::detail::r1::destroy(&local_28b8);
  aVar22 = _DAT_01feba00;
  aVar23 = _DAT_01feb9f0;
  aVar24 = _DAT_01feba00;
  aVar25 = _DAT_01feb9f0;
  if (local_2960 == (_func_int **)0x0) {
    sVar16 = 0;
    sVar9 = 0;
  }
  else {
    psVar15 = local_13f0;
    sVar9 = 0;
    sVar16 = 0;
    do {
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -9) = aVar25;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -7) = aVar22;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -5) = aVar23;
      *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)(psVar15 + -3) = aVar24;
      psVar15[-1] = sVar16;
      *psVar15 = sVar9;
      aVar25.m128 = (__m128)minps(aVar25.m128,*(undefined1 (*) [16])(psVar15 + -0x289));
      aVar22.m128 = (__m128)maxps(aVar22.m128,*(undefined1 (*) [16])(psVar15 + -0x287));
      aVar23.m128 = (__m128)minps(aVar23.m128,*(undefined1 (*) [16])(psVar15 + -0x285));
      aVar24.m128 = (__m128)maxps(aVar24.m128,*(undefined1 (*) [16])(psVar15 + -0x283));
      sVar16 = sVar16 + psVar15[-0x281];
      sVar9 = sVar9 + psVar15[-0x280];
      psVar15 = psVar15 + 10;
      local_2960 = (_func_int **)((long)local_2960 + -1);
    } while (local_2960 != (_func_int **)0x0);
  }
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 = aVar25;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 = aVar22;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 = aVar23;
  (pPVar21->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 = aVar24;
  pPVar21->begin = sVar16;
  pPVar21->end = sVar9;
  return pPVar21;
}

Assistant:

PrimInfo createPrimRefArrayGrids(GridMesh* mesh, mvector<PrimRef>& prims, mvector<SubGridBuildData>& sgrids)
    {
      unsigned int geomID_ = std::numeric_limits<unsigned int>::max ();

      PrimInfo pinfo(empty);
      size_t numPrimitives = 0;
      
      ParallelPrefixSumState<PrimInfo> pstate;
      /* iterate over all grids in a single mesh */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo
                                   {
                                     PrimInfo pinfo(empty);
                                     for (size_t j=r.begin(); j<r.end(); j++)
                                     {
                                       if (!mesh->valid(j)) continue;
                                       BBox3fa bounds = empty;
                                       const PrimRef prim(bounds,geomID_,unsigned(j));
                                       pinfo.add_center2(prim,mesh->getNumSubGrids(j));
                                     }
                                     return pinfo;
                                   }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });
      numPrimitives = pinfo.size();
      /* resize arrays */
      sgrids.resize(numPrimitives); 
      prims.resize(numPrimitives); 

      /* second run to fill primrefs and SubGridBuildData arrays */
      pinfo = parallel_prefix_sum( pstate, size_t(0), mesh->size(), size_t(1024), PrimInfo(empty), [&](const range<size_t>& r, const PrimInfo& base) -> PrimInfo {
        return mesh->createPrimRefArray(prims,sgrids,r,base.size(),geomID_);
      }, [](const PrimInfo& a, const PrimInfo& b) -> PrimInfo { return PrimInfo::merge(a,b); });

      return pinfo;
    }